

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall
CollisionCallback<Blob<128>_>::operator()(CollisionCallback<Blob<128>_> *this,void *key,int len)

{
  size_type sVar1;
  mapped_type *this_00;
  Blob<128> h;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  Blob<128> local_30;
  
  Blob<128>::Blob(&local_30);
  (*this->m_pfHash)(key,len,0,&local_30);
  sVar1 = std::set<Blob<128>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>::count
                    (&this->m_collisions->
                      super_set<Blob<128>,_std::less<Blob<128>_>,_std::allocator<Blob<128>_>_>,
                     &local_30);
  if (sVar1 != 0) {
    this_00 = std::
              map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
              ::operator[](&this->m_collmap->
                            super_map<Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>,_std::less<Blob<128>_>,_std::allocator<std::pair<const_Blob<128>,_std::vector<ByteVec,_std::allocator<ByteVec>_>_>_>_>
                           ,&local_30);
    ByteVec::ByteVec((ByteVec *)&_Stack_48,key,len);
    std::vector<ByteVec,_std::allocator<ByteVec>_>::emplace_back<ByteVec>
              (this_00,(ByteVec *)&_Stack_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
  }
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    hashtype h;

    m_pfHash(key,len,0,&h);

    if(m_collisions.count(h))
    {
      m_collmap[h].push_back( ByteVec(key,len) );
    }
  }